

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

JavascriptPromise *
Js::JavascriptPromise::InitializePromise_TTD
          (ScriptContext *scriptContext,uint32 status,bool isHandled,Var result,
          SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *resolveReactions
          ,SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *rejectReactions
          )

{
  Recycler *this;
  SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *pSVar1;
  JavascriptPromiseReaction *pJVar2;
  code *pcVar3;
  undefined1 auVar4 [8];
  NodeBase *pNVar5;
  JavascriptPromise *pJVar6;
  Recycler *alloc;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *addr;
  undefined4 *puVar7;
  Type *ppJVar8;
  undefined7 in_register_00000011;
  Type *addr_00;
  bool bVar9;
  bool bVar10;
  undefined1 local_90 [8];
  Iterator resolveIterator;
  undefined1 local_68 [8];
  JavascriptPromiseReactionPair pair;
  undefined1 local_48 [8];
  Iterator rejectIterator;
  
  this = scriptContext->recycler;
  pair.rejectReaction = (JavascriptPromiseReaction *)rejectReactions;
  rejectIterator.current = (NodeBase *)result;
  pJVar6 = JavascriptLibrary::CreatePromise
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  pJVar6->status = (Type)status;
  if ((int)CONCAT71(in_register_00000011,isHandled) != 0) {
    pJVar6->isHandled = true;
  }
  Memory::Recycler::WBSetBit((char *)&pJVar6->result);
  (pJVar6->result).ptr = rejectIterator.current;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pJVar6->result);
  local_90 = (undefined1  [8])
             &SList<Js::JavascriptPromiseReactionPair,Memory::Recycler,RealCount>::typeinfo;
  resolveIterator.list =
       (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0;
  resolveIterator.current = (NodeBase *)&DAT_ffffffffffffffff;
  alloc = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_90);
  addr = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
         new<Memory::Recycler>(0x18,alloc,0x38bbb2);
  (addr->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>).
  super_SListNodeBase<Memory::Recycler> = 0;
  ((RealCount *)
  ((long)&addr->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> + 8)
  )->count = 0;
  Memory::Recycler::WBSetBit((char *)addr);
  *(SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> **)
   &addr->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> = addr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  ((RealCount *)
  ((long)&addr->super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> + 8)
  )->count = 0;
  addr->allocator = this;
  addr_00 = &pJVar6->reactions;
  Memory::Recycler::WBSetBit((char *)addr_00);
  (pJVar6->reactions).ptr = addr;
  rejectIterator.current = (NodeBase *)pJVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  local_48 = (undefined1  [8])pair.rejectReaction;
  resolveIterator.list =
       (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
       (resolveReactions->
       super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>).
       super_SListNodeBase<Memory::HeapAllocator>.next;
  bVar9 = (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
          resolveIterator.list != resolveReactions;
  if (!bVar9) {
    resolveIterator.list =
         (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0;
  }
  rejectIterator.list =
       (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
       ((pair.rejectReaction)->super_FinalizableObject).super_IRecyclerVisitedObject.
       _vptr_IRecyclerVisitedObject;
  bVar10 = (JavascriptPromiseReaction *)rejectIterator.list != pair.rejectReaction;
  if (!bVar10) {
    rejectIterator.list =
         (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0;
  }
  local_90 = (undefined1  [8])resolveReactions;
  if (bVar9 && bVar10) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      ppJVar8 = SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::
                Iterator::Data((Iterator *)local_90);
      local_68 = (undefined1  [8])*ppJVar8;
      ppJVar8 = SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>::
                Iterator::Data((Iterator *)local_48);
      pair.resolveReaction = *ppJVar8;
      SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Prepend
                (&addr_00->ptr->
                  super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>,
                 addr_00->ptr->allocator,(JavascriptPromiseReactionPair *)local_68);
      if (resolveIterator.list ==
          (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar9) goto LAB_00d01a9a;
        *puVar7 = 0;
      }
      auVar4 = local_90;
      pSVar1 = (SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
               ((resolveIterator.list)->super_SListNodeBase<Memory::HeapAllocator>).next;
      bVar9 = (undefined1  [8])pSVar1 != local_90;
      resolveIterator.list =
           &((SList<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0)->
            super_SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount>;
      if (bVar9) {
        resolveIterator.list =
             (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)pSVar1;
      }
      if (rejectIterator.list ==
          (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar10 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                     ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar10) goto LAB_00d01a9a;
        *puVar7 = 0;
      }
      pJVar2 = (JavascriptPromiseReaction *)
               ((rejectIterator.list)->super_SListNodeBase<Memory::HeapAllocator>).next;
      bVar10 = (undefined1  [8])pJVar2 != local_48;
      rejectIterator.list =
           (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)
           (JavascriptPromiseReaction *)0x0;
      if (bVar10) {
        rejectIterator.list =
             (SListBase<Js::JavascriptPromiseReaction_*,_Memory::HeapAllocator,_RealCount> *)pJVar2;
      }
    } while (((undefined1  [8])pSVar1 != auVar4) && ((undefined1  [8])pJVar2 != local_48));
  }
  if ((bVar9) || (bVar10)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x730,"(hasResolve == false && hasReject == false)",
                                "mismatched resolve/reject reaction counts");
    if (!bVar9) {
LAB_00d01a9a:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  pNVar5 = rejectIterator.current;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Reverse
            ((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
             rejectIterator.current[5].next);
  return (JavascriptPromise *)pNVar5;
}

Assistant:

JavascriptPromise* JavascriptPromise::InitializePromise_TTD(ScriptContext* scriptContext, uint32 status, bool isHandled, Var result, SList<Js::JavascriptPromiseReaction*, HeapAllocator>& resolveReactions,SList<Js::JavascriptPromiseReaction*, HeapAllocator>& rejectReactions)
    {
        Recycler* recycler = scriptContext->GetRecycler();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        JavascriptPromise* promise = library->CreatePromise();

        promise->SetStatus((PromiseStatus)status);
        if (isHandled)
        {
            promise->SetIsHandled();
        }
        promise->result = result;

        promise->reactions = RecyclerNew(recycler, JavascriptPromiseReactionList, recycler);
        SList<Js::JavascriptPromiseReaction*, HeapAllocator>::Iterator resolveIterator = resolveReactions.GetIterator();
        SList<Js::JavascriptPromiseReaction*, HeapAllocator>::Iterator rejectIterator = rejectReactions.GetIterator();

        bool hasResolve = resolveIterator.Next();
        bool hasReject = rejectIterator.Next();
        while (hasResolve && hasReject)
        {
            JavascriptPromiseReactionPair pair;
            pair.resolveReaction = resolveIterator.Data();
            pair.rejectReaction = rejectIterator.Data();
            promise->reactions->Prepend(pair);
            hasResolve = resolveIterator.Next();
            hasReject = rejectIterator.Next();
        }
        AssertMsg(hasResolve == false && hasReject == false, "mismatched resolve/reject reaction counts");
        promise->reactions->Reverse();

        return promise;
    }